

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateNotImplementedMethods
          (ServiceGenerator *this,Printer *printer)

{
  long *plVar1;
  ServiceDescriptor *pSVar2;
  cpp *pcVar3;
  long lVar4;
  long lVar5;
  anon_class_1_0_00000001 local_319;
  Sub *local_318;
  Options *local_310;
  undefined1 local_308 [32];
  string local_2e8;
  string local_2c8;
  Printer *local_2a8;
  undefined1 local_2a0 [8];
  string local_298;
  string local_278;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  pSVar2 = this->descriptor_;
  if (0 < *(int *)(pSVar2 + 0x38)) {
    local_318 = &local_1a0;
    local_2a0 = (undefined1  [8])0x0;
    local_310 = (Options *)this;
    local_2a8 = printer;
    do {
      lVar5 = *(long *)(pSVar2 + 0x30);
      lVar4 = (long)local_2a0 * 0x50;
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"name","");
      io::Printer::Sub::Sub<std::__cxx11::string_const&>
                (&local_258,&local_2c8,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar5 + 8 + lVar4));
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"input","");
      pcVar3 = (cpp *)google::protobuf::MethodDescriptor::input_type();
      QualifiedClassName_abi_cxx11_(&local_278,pcVar3,(Descriptor *)local_310->split_map,local_310);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a0,&local_2e8,&local_278);
      local_308._0_8_ = local_308 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"output","");
      pcVar3 = (cpp *)google::protobuf::MethodDescriptor::output_type();
      QualifiedClassName_abi_cxx11_(&local_298,pcVar3,(Descriptor *)local_310->split_map,local_310);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_e8,(string *)local_308,&local_298);
      google::protobuf::io::Printer::Emit
                (local_2a8,&local_258,3,0x124,
                 "\n          void $classname$::$name$(::$proto_ns$::RpcController* controller,\n                                   const $input$*, $output$*, ::google::protobuf::Closure* done) {\n            controller->SetFailed(\"Method $name$() not implemented.\");\n            done->Run();\n          }\n        "
                );
      lVar5 = 0x228;
      do {
        if (local_278.field_2._M_local_buf[lVar5 + 8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_2a0 + lVar5));
        }
        plVar1 = *(long **)((long)&local_2c8._M_dataplus._M_p + lVar5);
        if ((long *)(local_2c8.field_2._M_local_buf + lVar5) != plVar1) {
          operator_delete(plVar1,*(long *)(local_2c8.field_2._M_local_buf + lVar5) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)local_2e8.field_2._M_local_buf[lVar5 + 8]]._M_data)
                  (&local_319,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_308 + lVar5 + 0x18));
        local_2e8.field_2._M_local_buf[lVar5 + 8] = -1;
        if ((long *)(local_308 + lVar5 + 8) != *(long **)((long)&local_310 + lVar5)) {
          operator_delete(*(long **)((long)&local_310 + lVar5),*(long *)(local_308 + lVar5 + 8) + 1)
          ;
        }
        lVar5 = lVar5 + -0xb8;
      } while (lVar5 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
        operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      local_2a0 = (undefined1  [8])((long)local_2a0 + 1);
      pSVar2 = (ServiceDescriptor *)local_310->access_info_map;
    } while ((long)local_2a0 < (long)*(int *)(pSVar2 + 0x38));
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateNotImplementedMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);

    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
        },
        R"cc(
          void $classname$::$name$(::$proto_ns$::RpcController* controller,
                                   const $input$*, $output$*, ::google::protobuf::Closure* done) {
            controller->SetFailed("Method $name$() not implemented.");
            done->Run();
          }
        )cc");
  }
}